

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O2

void __thiscall
gvr::MultiTexturedMesh::addGLObjects
          (MultiTexturedMesh *this,vector<gvr::GLObject_*,_std::allocator<gvr::GLObject_*>_> *list)

{
  return;
}

Assistant:

void MultiTexturedMesh::addGLObjects(std::vector<GLObject *> &list)
{
#ifdef INCLUDE_GL
  std::vector<bool> vused, tused;

  // splitting into individual meshs with single texture for each mesh

  for (size_t i=0; i<name.size(); i++)
  {
    if (getUsedByTexture(static_cast<int>(i), vused, tused))
    {
      TexturedMesh p(*this, static_cast<int>(i), vused, tused);
      list.push_back(new GLTexturedMesh(p));
    }
  }

#else
  assert(false);
#endif
}